

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::AssertionResultData::reconstructExpression_abi_cxx11_(AssertionResultData *this)

{
  bool bVar1;
  ulong uVar2;
  long in_RSI;
  string *in_RDI;
  ReusableStringStream rss;
  ReusableStringStream *this_00;
  string *this_01;
  string local_58 [24];
  ReusableStringStream *in_stack_ffffffffffffffc0;
  ReusableStringStream *in_stack_ffffffffffffffd0;
  ReusableStringStream local_28;
  
  this_01 = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) &&
     (bVar1 = LazyExpression::operator_cast_to_bool((LazyExpression *)(in_RSI + 0x40)), bVar1)) {
    this_00 = &local_28;
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffc0);
    ReusableStringStream::operator<<((ReusableStringStream *)this_01,(LazyExpression *)this_00);
    ReusableStringStream::str_abi_cxx11_(this_00);
    std::__cxx11::string::operator=((string *)(in_RSI + 0x20),local_58);
    std::__cxx11::string::~string(local_58);
    ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffd0);
  }
  std::__cxx11::string::string((string *)this_01,(string *)(in_RSI + 0x20));
  return in_RDI;
}

Assistant:

std::string AssertionResultData::reconstructExpression() const {

        if( reconstructedExpression.empty() ) {
            if( lazyExpression ) {
                ReusableStringStream rss;
                rss << lazyExpression;
                reconstructedExpression = rss.str();
            }
        }
        return reconstructedExpression;
    }